

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O3

void mbedtls_ssl_buffering_free(mbedtls_ssl_context *ssl)

{
  int iVar1;
  
  if (ssl->handshake != (mbedtls_ssl_handshake_params *)0x0) {
    ssl_free_buffered_record((mbedtls_ssl_context *)ssl->handshake);
    iVar1 = 0;
    do {
      ssl_buffering_free_slot((mbedtls_ssl_context *)ssl->handshake,(uint8_t)iVar1);
      iVar1 = iVar1 + 1;
    } while (iVar1 != 4);
  }
  return;
}

Assistant:

void mbedtls_ssl_buffering_free(mbedtls_ssl_context *ssl)
{
    unsigned offset;
    mbedtls_ssl_handshake_params * const hs = ssl->handshake;

    if (hs == NULL) {
        return;
    }

    ssl_free_buffered_record(ssl);

    for (offset = 0; offset < MBEDTLS_SSL_MAX_BUFFERED_HS; offset++) {
        ssl_buffering_free_slot(ssl, offset);
    }
}